

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

value * __thiscall cppcms::json::value::at(value *this,char *cpath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
  *this_00;
  iterator iVar2;
  bad_value_cast *pbVar3;
  long *plVar4;
  char *pcVar5;
  size_type *psVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  string_key path;
  char local_d8 [16];
  string local_c8;
  key_type local_a8;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar5 = cpath + -1;
  do {
    pcVar8 = pcVar5 + 1;
    pcVar5 = pcVar5 + 1;
  } while (*pcVar8 != '\0');
  local_d8[0] = '\0';
  paVar1 = &local_a8.key_.field_2;
  uVar11 = 0;
  do {
    pcVar8 = cpath;
    local_a8.end_ = pcVar5;
    if (cpath == (char *)0x0) {
      pcVar8 = local_d8;
      local_a8.end_ = local_d8;
    }
    uVar9 = (long)local_a8.end_ - (long)pcVar8;
    if (uVar11 < uVar9) {
      local_a8.begin_ = pcVar8 + uVar11;
      uVar10 = uVar11;
      do {
        if (pcVar8[uVar10] == '.') break;
        uVar10 = uVar10 + 1;
      } while (uVar10 <= uVar9);
      if (uVar9 <= uVar10) {
        uVar10 = 0xffffffffffffffff;
      }
      if (uVar10 - uVar11 <= (ulong)((long)local_a8.end_ - (long)local_a8.begin_)) {
        local_a8.end_ = pcVar8 + uVar10;
      }
    }
    else {
      local_a8.begin_ = (char *)0x0;
      local_a8.end_ = (char *)0x0;
      uVar10 = 0xffffffffffffffff;
    }
    local_a8.key_._M_string_length = 0;
    local_a8.key_.field_2._M_local_buf[0] = '\0';
    local_a8.key_._M_dataplus._M_p = (pointer)paVar1;
    if ((local_a8.begin_ == (char *)0x0) || (local_a8.end_ == local_a8.begin_)) {
      pbVar3 = (bad_value_cast *)__cxa_allocate_exception(0x48);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"Invalid path provided","");
      bad_value_cast::bad_value_cast(pbVar3,&local_c8);
      __cxa_throw(pbVar3,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
    }
    if ((*(variant **)this)->type != is_object) {
      pbVar3 = (bad_value_cast *)__cxa_allocate_exception(0x48);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
      bad_value_cast::bad_value_cast
                (pbVar3,&local_c8,*(json_type *)&(*(_Base_ptr *)this)[1]._M_left,is_object);
      __cxa_throw(pbVar3,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
    }
    this_00 = &variant::
               get<std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>
                         (*(variant **)this)->_M_t;
    iVar2 = std::
            _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
            ::find(this_00,&local_a8);
    if ((_Rb_tree_header *)iVar2._M_node == &(this_00->_M_impl).super__Rb_tree_header) {
      pbVar3 = (bad_value_cast *)__cxa_allocate_exception(0x48);
      string_key::str_abi_cxx11_(&local_70,&local_a8);
      std::operator+(&local_50,"Member ",&local_70);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_c8._M_dataplus._M_p = (pointer)*plVar4;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_c8._M_dataplus._M_p == psVar6) {
        local_c8.field_2._M_allocated_capacity = *psVar6;
        local_c8.field_2._8_8_ = plVar4[3];
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar6;
      }
      local_c8._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      bad_value_cast::bad_value_cast(pbVar3,&local_c8);
      __cxa_throw(pbVar3,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.key_._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8.key_._M_dataplus._M_p);
    }
    this = (value *)&iVar2._M_node[2]._M_left;
    pcVar7 = cpath;
    pcVar8 = pcVar5;
    if (cpath == (char *)0x0) {
      pcVar7 = local_d8;
      pcVar8 = local_d8;
    }
    if ((uVar10 == 0xffffffffffffffff) ||
       (uVar11 = uVar10 + 1, (ulong)((long)pcVar8 - (long)pcVar7) <= uVar11)) {
      return (value *)(_Base_ptr *)this;
    }
  } while( true );
}

Assistant:

value &value::at(char const *cpath)
	{
		string_key path=string_key::unowned(cpath);
		value *ptr=this;
		size_t pos=0;
		size_t new_pos;
		do {
			new_pos=path.find('.',pos);
			string_key part=path.unowned_substr(pos,new_pos - pos);
			if(new_pos!=std::string::npos)
				new_pos++;
			if(part.empty())
				throw bad_value_cast("Invalid path provided");
			if(ptr->type()!=json::is_object)
				throw bad_value_cast("",ptr->type(),json::is_object);
			json::object &obj=ptr->object();
			json::object::iterator p;
			if((p=obj.find(part))==obj.end())
				throw bad_value_cast("Member "+part.str()+" not found");
			ptr=&p->second;
			pos=new_pos;

		} while(new_pos < path.size());
		return *ptr;
	}